

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

bool __thiscall QTipLabel::tipChanged(QTipLabel *this,QPoint *pos,QString *text,QObject *o)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int iVar9;
  undefined1 auVar8 [16];
  QStringView QVar10;
  QStringView QVar11;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::text(&local_50,&instance->super_QLabel);
  lVar5 = (text->d).size;
  if (local_50.d.size == lVar5) {
    QVar10.m_data = local_50.d.ptr;
    QVar10.m_size = local_50.d.size;
    QVar11.m_data = (text->d).ptr;
    QVar11.m_size = lVar5;
    bVar6 = QtPrivate::equalStrings(QVar10,QVar11);
  }
  else {
    bVar6 = 0;
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      local_50.d.d = (Data *)QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar7 = CONCAT71((int7)((ulong)local_50.d.d >> 8),1);
  if ((bVar6 & this->widget == (QWidget *)o) == 1) {
    uVar1 = (this->rect).x1;
    uVar3 = (this->rect).y1;
    uVar2 = (this->rect).x2;
    uVar4 = (this->rect).y2;
    auVar8._0_4_ = -(uint)(uVar2 == uVar1 + -1);
    iVar9 = -(uint)(uVar4 == uVar3 + -1);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = iVar9;
    auVar8._12_4_ = iVar9;
    iVar9 = movmskpd((int)uVar7,auVar8);
    if (iVar9 == 3) {
      uVar7 = 0;
    }
    else {
      bVar6 = QRect::contains((QPoint *)&this->rect,SUB81(pos,0));
      uVar7 = (ulong)(bVar6 ^ 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB81(uVar7,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QTipLabel::tipChanged(const QPoint &pos, const QString &text, QObject *o)
{
    if (QTipLabel::instance->text() != text)
        return true;

    if (o != widget)
        return true;

    if (!rect.isNull())
        return !rect.contains(pos);
    else
       return false;
}